

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,ByteData *byte_data)

{
  pointer *this_00;
  size_t sVar1;
  const_reference pvVar2;
  CfdException *pCVar3;
  allocator local_151;
  string local_150;
  size_t local_130;
  CfdSourceLocation local_128;
  ByteData local_110;
  allocator<unsigned_char> local_f1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  CfdSourceLocation local_40;
  ByteData *local_18;
  ByteData *byte_data_local;
  ConfidentialAssetId *this_local;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_003ebf28;
  local_18 = byte_data;
  byte_data_local = (ByteData *)this;
  ByteData::ByteData(&this->data_);
  this->version_ = '\0';
  sVar1 = ByteData::GetDataSize(local_18);
  if (sVar1 == 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x187;
    local_40.funcname = "ConfidentialAssetId";
    ByteData::GetBytes(&local_78,local_18);
    StringUtil::ByteToString_abi_cxx11_((StringUtil *)&local_60,&local_78);
    logger::warn<std::__cxx11::string>
              (&local_40,"Empty ConfidentialAssetId. byte_data={}.",&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
    data._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_98,"Empty AssetId is invalid.",(allocator *)((long)&data + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_98);
    data._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (sVar1 == 0x20) {
    ByteData::operator=(&this->data_,local_18);
    this->version_ = '\x01';
  }
  else {
    if (sVar1 != 0x21) {
      local_128.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_128.filename = local_128.filename + 1;
      local_128.line = 0x19c;
      local_128.funcname = "ConfidentialAssetId";
      local_130 = ByteData::GetDataSize(local_18);
      logger::warn<unsigned_long>(&local_128,"AssetId size Invalid. size={}.",&local_130);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_150,"AssetId size Invalid.",&local_151);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_150);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
    this_00 = &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_e8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    local_e0 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_e8,1);
    local_f0._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    ::std::allocator<unsigned_char>::allocator(&local_f1);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_e0,local_f0,
               &local_f1);
    ::std::allocator<unsigned_char>::~allocator(&local_f1);
    pvVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
    this->version_ = *pvVar2;
    if (this->version_ != '\0') {
      ByteData::ByteData(&local_110,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      ByteData::operator=(&this->data_,&local_110);
      ByteData::~ByteData(&local_110);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  CheckVersion(this->version_);
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const ByteData &byte_data)
    : data_(), version_(0) {
  switch (byte_data.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. byte_data={}.",
          StringUtil::ByteToString(byte_data.GetBytes()));
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      data_ = byte_data;
      version_ = kConfidentialVersion_1;
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = byte_data.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ != 0) {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          byte_data.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}